

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_pack_external_
               (char *datarep,void *inbuf,MPIABI_Fint *incount,MPIABI_Fint *datatype,void *outbuf,
               MPIABI_Fint *outsize,MPIABI_Fint *position,MPIABI_Fint *ierror,size_t datarep_len)

{
  mpi_pack_external_();
  return;
}

Assistant:

void mpiabi_pack_external_(
  const char * datarep,
  const void * inbuf,
  const MPIABI_Fint * incount,
  const MPIABI_Fint * datatype,
  void * outbuf,
  const MPIABI_Fint * outsize,
  MPIABI_Fint * position,
  MPIABI_Fint * ierror,
  size_t datarep_len
) {
  return mpi_pack_external_(
    datarep,
    inbuf,
    incount,
    datatype,
    outbuf,
    outsize,
    position,
    ierror,
    datarep_len
  );
}